

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O2

void mserialize::detail::
     BuiltinDeserializer<std::unique_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>,_void>
     ::deserialize<InputStream>
               (unique_ptr<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>
                *opt,InputStream *istream)

{
  uint8_t discriminator;
  uchar local_19;
  
  TrivialDeserializer<unsigned_char>::deserialize<InputStream>(&local_19,istream);
  if (local_19 == '\0') {
    std::
    __uniq_ptr_impl<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>
    ::reset((__uniq_ptr_impl<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>
             *)opt,(pointer)0x0);
  }
  else {
    BuiltinDeserializer<std::unique_ptr<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>,std::default_delete<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>>>,void>
    ::
    make_nonempty<std::unique_ptr<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>,std::default_delete<std::vector<std::tuple<int>,std::allocator<std::tuple<int>>>>>>
              (opt);
    BuiltinDeserializer<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_void>::
    deserialize<InputStream>
              ((opt->_M_t).
               super___uniq_ptr_impl<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_*,_std::default_delete<std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_>_>
               .
               super__Head_base<0UL,_std::vector<std::tuple<int>,_std::allocator<std::tuple<int>_>_>_*,_false>
               ._M_head_impl,istream);
  }
  return;
}

Assistant:

static void deserialize(Optional& opt, InputStream& istream)
  {
    std::uint8_t discriminator;
    mserialize::deserialize(discriminator, istream);
    if (discriminator)
    {
      assert(discriminator == 1 && "Discriminator of non-empty optional must be 1");
      make_nonempty(opt);
      mserialize::deserialize(*opt, istream);
    }
    else
    {
      opt = {};
    }
  }